

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void hero_sits(tgestate_t *state)

{
  set_roomdef(state,'\x19',0x26,0x13);
  hero_sit_sleep_common(state,&state->hero_in_breakfast);
  return;
}

Assistant:

void hero_sits(tgestate_t *state)
{
  assert(state != NULL);

  set_roomdef(state,
              room_25_MESS_HALL,
              roomdef_25_BENCH_G,
              interiorobject_PRISONER_SAT_END_TABLE);
  hero_sit_sleep_common(state, &state->hero_in_breakfast);
}